

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockStrictOrderTest.cpp
# Opt level: O0

void __thiscall
TEST_MockStrictOrderTest_orderViolatedAcrossScopes_TestShell::
~TEST_MockStrictOrderTest_orderViolatedAcrossScopes_TestShell
          (TEST_MockStrictOrderTest_orderViolatedAcrossScopes_TestShell *this)

{
  TEST_MockStrictOrderTest_orderViolatedAcrossScopes_TestShell *this_local;
  
  ~TEST_MockStrictOrderTest_orderViolatedAcrossScopes_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockStrictOrderTest, orderViolatedAcrossScopes)
{
    mock("mock1").strictOrder();
    mock("mock2").strictOrder();

    mock("mock1").expectOneCall("foo1");
    mock("mock2").expectOneCall("foo2");
    mock("mock2").actualCall("foo2");
    mock("mock1").actualCall("foo1");

    mock("mock1").checkExpectations();
    mock("mock2").checkExpectations();
}